

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O0

bool __thiscall
CommandLineTestRunner::parseArguments(CommandLineTestRunner *this,TestPlugin *plugin)

{
  TestOutput *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  SimpleString *pSVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *local_38;
  TestPlugin *plugin_local;
  CommandLineTestRunner *this_local;
  
  bVar2 = CommandLineArguments::parse(this->arguments_,plugin);
  if (bVar2) {
    bVar2 = CommandLineArguments::isJUnitOutput(this->arguments_);
    if (bVar2) {
      pSVar4 = CommandLineArguments::getPackageName(this->arguments_);
      iVar3 = (*this->_vptr_CommandLineTestRunner[3])(this,pSVar4);
      this->output_ = (TestOutput *)CONCAT44(extraout_var_00,iVar3);
      bVar2 = CommandLineArguments::isVerbose(this->arguments_);
      if ((bVar2) || (bVar2 = CommandLineArguments::isVeryVerbose(this->arguments_), bVar2)) {
        pTVar1 = this->output_;
        iVar3 = (*this->_vptr_CommandLineTestRunner[4])();
        iVar3 = (*this->_vptr_CommandLineTestRunner[5])(this,pTVar1,CONCAT44(extraout_var_01,iVar3))
        ;
        this->output_ = (TestOutput *)CONCAT44(extraout_var_02,iVar3);
      }
    }
    else {
      bVar2 = CommandLineArguments::isTeamCityOutput(this->arguments_);
      if (bVar2) {
        iVar3 = (*this->_vptr_CommandLineTestRunner[2])();
        this->output_ = (TestOutput *)CONCAT44(extraout_var_03,iVar3);
      }
      else {
        iVar3 = (*this->_vptr_CommandLineTestRunner[4])();
        this->output_ = (TestOutput *)CONCAT44(extraout_var_04,iVar3);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    iVar3 = (*this->_vptr_CommandLineTestRunner[4])();
    this->output_ = (TestOutput *)CONCAT44(extraout_var,iVar3);
    pTVar1 = this->output_;
    bVar2 = CommandLineArguments::needHelp(this->arguments_);
    if (bVar2) {
      local_38 = CommandLineArguments::help(this->arguments_);
    }
    else {
      local_38 = CommandLineArguments::usage(this->arguments_);
    }
    (*pTVar1->_vptr_TestOutput[0xb])(pTVar1,local_38);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CommandLineTestRunner::parseArguments(TestPlugin* plugin)
{
  if (!arguments_->parse(plugin)) {
    output_ = createConsoleOutput();
    output_->print((arguments_->needHelp()) ? arguments_->help() : arguments_->usage());
    return false;
  }

  if (arguments_->isJUnitOutput()) {
    output_= createJUnitOutput(arguments_->getPackageName());
    if (arguments_->isVerbose() || arguments_->isVeryVerbose())
      output_ = createCompositeOutput(output_, createConsoleOutput());
  } else if (arguments_->isTeamCityOutput()) {
    output_ = createTeamCityOutput();
  } else
    output_ = createConsoleOutput();
  return true;
}